

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_flash_attn_back(ggml_compute_params *params,bool masked,ggml_tensor *dst)

{
  uint *puVar1;
  float *x;
  int *piVar2;
  ggml_type gVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  long lVar7;
  ggml_tensor *pgVar8;
  long lVar9;
  int64_t iVar10;
  void *pvVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined8 uVar26;
  int iVar27;
  byte bVar28;
  byte bVar29;
  size_t sVar30;
  void *pvVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  void *pvVar39;
  char *pcVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  int iVar44;
  uint n;
  long lVar45;
  long lVar46;
  long lVar47;
  undefined7 in_register_00000031;
  void *pvVar48;
  undefined8 uVar49;
  ggml_compute_params *pgVar50;
  ulong uVar51;
  ulong uVar52;
  int iVar53;
  int np_3;
  uint uVar54;
  uint n_00;
  ushort uVar55;
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  float fVar72;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar74 [16];
  ggml_float gVar73;
  undefined1 auVar75 [16];
  undefined1 extraout_var [56];
  int64_t i_1;
  int np;
  int local_38c;
  int local_388;
  int i;
  long local_378;
  float local_34c;
  ggml_compute_params *local_348;
  long local_340;
  long local_338;
  int64_t local_330;
  int64_t local_328;
  ulong local_320;
  ggml_tensor *local_318;
  long local_310;
  int local_304;
  uint local_300;
  undefined4 local_2fc;
  long local_2f8;
  void *local_2f0;
  long local_2e8;
  long local_2e0;
  size_t local_2d8;
  long local_2d0;
  size_t local_2c8;
  ggml_tensor *local_2c0;
  long local_2b8;
  void *local_2b0;
  long local_2a8;
  long local_2a0;
  size_t local_298;
  long local_290;
  size_t local_288;
  ggml_tensor *local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  ulong local_218;
  void *local_210;
  long local_208;
  size_t local_200;
  size_t local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  ulong local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  long local_178;
  long local_170;
  void *local_168;
  float *local_160;
  void *local_158;
  long local_150;
  size_t local_148;
  long local_140;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  pgVar4 = dst->src[0];
  local_2fc = (undefined4)CONCAT71(in_register_00000031,masked);
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1d05,"fatal error");
  }
  pgVar5 = dst->src[1];
  lVar6 = pgVar4->ne[0];
  local_340 = pgVar4->ne[1];
  lVar7 = pgVar5->ne[1];
  iVar27 = (int)lVar7;
  local_300 = iVar27 + 3U & 0xfffffffc;
  local_2e0 = (long)(int)local_300;
  lVar47 = local_2e0;
  if (local_2e0 < lVar6) {
    lVar47 = lVar6;
  }
  local_2e8 = lVar7 - local_340;
  if (local_2e8 < 0) {
    pcVar40 = "P >= 0";
    uVar49 = 0x1bde;
  }
  else if (pgVar4->nb[0] == 4) {
    if (pgVar5->nb[0] == 4) {
      local_318 = dst->src[2];
      if (local_318->nb[0] == 4) {
        if (pgVar5->ne[0] == lVar6) {
          if (local_318->ne[1] == lVar6) {
            pgVar8 = dst->src[3];
            if (pgVar8->ne[0] == lVar6) {
              if (pgVar8->ne[1] == local_340) {
                if (dst->nb[0] == 4) {
                  if (dst->nb[1] < 4) {
                    pcVar40 = "nb0 <= nb1";
                    uVar49 = 0x1bf0;
                  }
                  else if (dst->nb[2] < dst->nb[1]) {
                    pcVar40 = "nb1 <= nb2";
                    uVar49 = 0x1bf1;
                  }
                  else if (dst->nb[3] < dst->nb[2]) {
                    pcVar40 = "nb2 <= nb3";
                    uVar49 = 0x1bf2;
                  }
                  else {
                    local_2c8 = pgVar4->nb[1];
                    local_1f8 = pgVar4->nb[2];
                    local_328 = pgVar4->ne[2];
                    iVar33 = params->ith;
                    iVar32 = params->nth;
                    local_220 = pgVar4->nb[3];
                    lVar9 = pgVar5->ne[2];
                    local_148 = local_318->nb[1];
                    local_240 = local_318->nb[3];
                    iVar10 = pgVar5->ne[3];
                    local_298 = pgVar5->nb[1];
                    local_228 = pgVar5->nb[2];
                    local_230 = pgVar5->nb[3];
                    local_238 = local_318->nb[2];
                    local_330 = local_318->ne[0];
                    local_288 = pgVar8->nb[0];
                    local_2d8 = pgVar8->nb[1];
                    local_200 = pgVar8->nb[2];
                    local_248 = pgVar8->nb[3];
                    local_348 = params;
                    local_280 = pgVar8;
                    if (iVar33 == 0) {
                      memset(dst->data,0,dst->ne[3] * dst->ne[2] * dst->ne[1] * dst->ne[0] * 4);
                    }
                    ggml_barrier(local_348->threadpool);
                    local_2c0 = pgVar4;
                    lVar34 = ggml_nelements(pgVar4);
                    lVar35 = ggml_nelements(pgVar5);
                    gVar3 = dst->type;
                    lVar36 = ggml_blck_size(gVar3);
                    if (lVar36 == 1) {
                      lVar36 = ggml_type_size(gVar3);
                      auVar58._8_56_ = extraout_var;
                      auVar58._0_8_ = extraout_XMM0_Qa;
                      local_388 = (int)lVar9;
                      iVar53 = (int)iVar10 * local_388;
                      local_2f0 = dst->data;
                      iVar32 = (iVar53 + -1 + iVar32) / iVar32;
                      auVar74._0_4_ = (float)lVar6;
                      auVar74._4_12_ = auVar58._4_12_;
                      iVar44 = iVar32 * iVar33;
                      iVar32 = iVar32 + iVar44;
                      if (iVar53 <= iVar32) {
                        iVar32 = iVar53;
                      }
                      if (auVar74._0_4_ < 0.0) {
                        fVar72 = sqrtf(auVar74._0_4_);
                      }
                      else {
                        auVar74 = vsqrtss_avx(auVar74,auVar74);
                        fVar72 = auVar74._0_4_;
                      }
                      if (iVar44 < iVar32) {
                        n_00 = (uint)lVar6;
                        local_198 = (ulong)(n_00 & 0xffffffc0);
                        auVar56 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        local_2f8 = (long)iVar44;
                        lVar38 = (long)(int)(n_00 & 0xffffffc0);
                        local_218 = local_328 / lVar9;
                        i_1._0_4_ = (int)lVar47;
                        local_2e8 = local_2e8 + 1;
                        uVar51 = lVar34 * lVar36 + 0xfU & 0xfffffffffffffff0;
                        local_178 = (long)(int)i_1 + 0x10;
                        local_170 = (iVar33 * 2) * local_178;
                        local_138 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar72)));
                        local_1d8 = local_218 & 0x7fffffff;
                        lVar47 = (long)(int)n_00;
                        if ((long)(int)n_00 < lVar38 + 1) {
                          lVar47 = lVar38 + 1;
                        }
                        local_328 = local_328 << 2;
                        auVar59 = vpbroadcastq_avx512f();
                        local_b8 = vmovdqu64_avx512f(auVar59);
                        auVar59 = vpbroadcastq_avx512f();
                        local_338 = (long)(int)i_1 * 4 + 0x40 + local_170 * 4;
                        local_190 = (lVar47 - lVar38) + 0xfU & 0xfffffffffffffff0;
                        local_250 = (lVar35 * lVar36 + 0xfU & 0xfffffffffffffff0) + uVar51 +
                                    (long)local_2f0;
                        local_f8 = vmovdqu64_avx512f(auVar59);
                        local_258 = lVar38 * 4;
                        auVar59 = vpbroadcastq_avx512f();
                        local_210 = (void *)((long)local_2f0 + lVar38 * 4);
                        uVar52 = (local_2e0 - iVar27) + 0xfU & 0xfffffffffffffff0;
                        local_188 = (ulong)(iVar27 + 0xfU & 0xfffffff0);
                        local_78 = vmovdqu64_avx512f(auVar59);
                        local_1d0 = (long)iVar27 * 4 + local_170 * 4;
                        local_270 = lVar6 * lVar7;
                        local_208 = lVar6 * local_340;
                        local_260 = uVar51 + lVar38 * 4 + (long)local_2f0;
                        local_150 = local_330 * 4;
                        local_330 = local_330 * lVar6;
                        local_2a0 = lVar6 * 4;
                        local_268 = (long)local_2f0 + uVar51;
                        lVar47 = local_170 * 4;
                        pgVar50 = local_348;
                        local_180 = uVar52;
                        do {
                          if (0 < (int)local_218) {
                            iVar33 = (int)(local_2f8 / lVar9);
                            local_278 = (long)iVar33;
                            local_320 = 0;
                            local_38c = (int)local_2f8 - local_388 * iVar33;
                            lVar35 = (long)local_38c;
                            local_1a0 = local_238 * lVar35 + local_278 * local_240;
                            lVar34 = local_278 * local_230 + local_228 * lVar35;
                            local_1e0 = local_278 * local_220;
                            local_1e8 = local_328 * local_278;
                            local_278 = local_278 * local_248;
                            local_1a8 = lVar34 + local_258;
                            local_1f0 = local_258 + local_1e0;
                            local_1b0 = local_1e8 + lVar35 * 4;
                            local_1b8 = local_270 * local_1b0;
                            local_1b0 = local_1b0 * local_330;
                            local_1c0 = local_268 + local_1b8;
                            local_1b8 = local_1b8 + local_260;
                            local_1c8 = local_250 + local_1b0;
                            local_1b0 = local_1b0 + local_250;
                            local_310 = lVar34;
                            local_304 = local_38c;
                            do {
                              if (0 < local_340) {
                                local_378 = 0;
                                local_2a8 = local_1f8 * (long)local_38c;
                                local_2b8 = local_1f0 + local_2a8;
                                local_2a8 = local_2a8 + local_1e0;
                                lVar35 = (local_1e8 + (long)local_38c * 4) * local_208;
                                local_168 = (void *)((long)local_210 + lVar35);
                                local_2b0 = (void *)(lVar35 + (long)local_2f0);
                                lVar35 = (long)((int)local_320 * local_388 + local_304);
                                local_2d0 = lVar35 * local_200;
                                local_290 = local_1f8 * lVar35 + local_1e0;
                                do {
                                  sVar30 = local_298;
                                  pgVar4 = local_2c0;
                                  pvVar11 = pgVar50->wdata;
                                  if (iVar27 < (int)local_2e0) {
                                    uVar51 = 0;
                                    do {
                                      auVar60 = vpbroadcastq_avx512f();
                                      auVar61 = vporq_avx512f(auVar60,auVar57);
                                      auVar60 = vporq_avx512f(auVar60,auVar58);
                                      uVar49 = vpcmpuq_avx512f(auVar60,auVar59,2);
                                      uVar26 = vpcmpuq_avx512f(auVar61,auVar59,2);
                                      bVar28 = (byte)uVar26;
                                      uVar55 = CONCAT11(bVar28,(byte)uVar49);
                                      puVar1 = (uint *)((long)pvVar11 + uVar51 * 4 + local_1d0);
                                      bVar12 = (bool)((byte)uVar49 & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar19 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar20 = (bool)(bVar28 >> 1 & 1);
                                      bVar21 = (bool)(bVar28 >> 2 & 1);
                                      bVar22 = (bool)(bVar28 >> 3 & 1);
                                      bVar23 = (bool)(bVar28 >> 4 & 1);
                                      bVar24 = (bool)(bVar28 >> 5 & 1);
                                      bVar25 = (bool)(bVar28 >> 6 & 1);
                                      *puVar1 = (uint)bVar12 * auVar56._0_4_ |
                                                (uint)!bVar12 * *puVar1;
                                      puVar1[1] = (uint)bVar13 * auVar56._4_4_ |
                                                  (uint)!bVar13 * puVar1[1];
                                      puVar1[2] = (uint)bVar14 * auVar56._8_4_ |
                                                  (uint)!bVar14 * puVar1[2];
                                      puVar1[3] = (uint)bVar15 * auVar56._12_4_ |
                                                  (uint)!bVar15 * puVar1[3];
                                      puVar1[4] = (uint)bVar16 * auVar56._16_4_ |
                                                  (uint)!bVar16 * puVar1[4];
                                      puVar1[5] = (uint)bVar17 * auVar56._20_4_ |
                                                  (uint)!bVar17 * puVar1[5];
                                      puVar1[6] = (uint)bVar18 * auVar56._24_4_ |
                                                  (uint)!bVar18 * puVar1[6];
                                      puVar1[7] = (uint)bVar19 * auVar56._28_4_ |
                                                  (uint)!bVar19 * puVar1[7];
                                      puVar1[8] = (uint)(bVar28 & 1) * auVar56._32_4_ |
                                                  (uint)!(bool)(bVar28 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar20 * auVar56._36_4_ |
                                                  (uint)!bVar20 * puVar1[9];
                                      puVar1[10] = (uint)bVar21 * auVar56._40_4_ |
                                                   (uint)!bVar21 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar22 * auVar56._44_4_ |
                                                    (uint)!bVar22 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar23 * auVar56._48_4_ |
                                                    (uint)!bVar23 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar24 * auVar56._52_4_ |
                                                    (uint)!bVar24 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar25 * auVar56._56_4_ |
                                                    (uint)!bVar25 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar28 >> 7) * auVar56._60_4_ |
                                                    (uint)!(bool)(bVar28 >> 7) * puVar1[0xf];
                                      uVar51 = uVar51 + 0x10;
                                    } while (uVar52 != uVar51);
                                  }
                                  x = (float *)((long)pvVar11 + local_170 * 4);
                                  lVar35 = local_2e8 + local_378;
                                  if ((char)local_2fc == '\0') {
                                    lVar35 = lVar7;
                                  }
                                  if (0 < lVar35) {
                                    lVar45 = 0;
                                    lVar38 = local_378 * local_2c8;
                                    lVar36 = lVar35;
                                    do {
                                      ggml_vec_dot_f32(n_00,(float *)((lVar45 >> 0x1e) + (long)x),0,
                                                       (float *)((long)pgVar5->data +
                                                                lVar34 + (lVar45 >> 0x20) * sVar30),
                                                       0,(float *)((long)pgVar4->data +
                                                                  local_290 + lVar38),0,1);
                                      lVar45 = lVar45 + 0x100000000;
                                      lVar36 = lVar36 + -1;
                                      lVar34 = local_310;
                                    } while (lVar36 != 0);
                                  }
                                  pvVar31 = local_168;
                                  uVar52 = local_190;
                                  uVar51 = local_198;
                                  auVar58 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  n = (uint)lVar35;
                                  np = n & 0xffffffc0;
                                  if (0 < (int)(n & 0xffffffc0)) {
                                    pvVar39 = (void *)(lVar47 + (long)pvVar11);
                                    uVar41 = 0;
                                    do {
                                      lVar34 = 0;
                                      do {
                                        auVar56 = vmulps_avx512f(local_138,
                                                                 *(undefined1 (*) [64])
                                                                  ((long)pvVar39 + lVar34));
                                        *(undefined1 (*) [64])((long)pvVar39 + lVar34) = auVar56;
                                        lVar34 = lVar34 + 0x40;
                                      } while (lVar34 != 0x100);
                                      uVar41 = uVar41 + 0x40;
                                      pvVar39 = (void *)((long)pvVar39 + 0x100);
                                    } while (uVar41 < (n & 0xffffffc0));
                                  }
                                  auVar56 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                  uVar41 = (ulong)np;
                                  if (np != n) {
                                    uVar43 = uVar41 | 1;
                                    if ((long)(uVar41 | 1) <= (long)(int)n) {
                                      uVar43 = (long)(int)n;
                                    }
                                    auVar59 = vpbroadcastq_avx512f();
                                    uVar42 = 0;
                                    lVar34 = uVar41 * 4 + lVar47;
                                    do {
                                      auVar60 = vpbroadcastq_avx512f();
                                      auVar61 = vporq_avx512f(auVar60,auVar58);
                                      auVar60 = vporq_avx512f(auVar60,auVar57);
                                      uVar49 = vpcmpuq_avx512f(auVar60,auVar59,2);
                                      bVar28 = (byte)uVar49;
                                      uVar49 = vpcmpuq_avx512f(auVar61,auVar59,2);
                                      bVar29 = (byte)uVar49;
                                      uVar55 = CONCAT11(bVar29,bVar28);
                                      piVar2 = (int *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      auVar60._4_4_ = (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                      auVar60._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                      auVar60._8_4_ = (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                      auVar60._12_4_ = (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                      auVar60._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                      auVar60._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                      auVar60._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                      auVar60._28_4_ = (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                      auVar60._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                      auVar60._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                      auVar60._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                      auVar60._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                      auVar60._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                      auVar60._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                      auVar60._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                      auVar60._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                      auVar60 = vmulps_avx512f(local_138,auVar60);
                                      puVar1 = (uint *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar19 = (bool)(bVar29 >> 1 & 1);
                                      bVar20 = (bool)(bVar29 >> 2 & 1);
                                      bVar21 = (bool)(bVar29 >> 3 & 1);
                                      bVar22 = (bool)(bVar29 >> 4 & 1);
                                      bVar23 = (bool)(bVar29 >> 5 & 1);
                                      bVar24 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar60._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar12 * auVar60._4_4_ |
                                                  (uint)!bVar12 * puVar1[1];
                                      puVar1[2] = (uint)bVar13 * auVar60._8_4_ |
                                                  (uint)!bVar13 * puVar1[2];
                                      puVar1[3] = (uint)bVar14 * auVar60._12_4_ |
                                                  (uint)!bVar14 * puVar1[3];
                                      puVar1[4] = (uint)bVar15 * auVar60._16_4_ |
                                                  (uint)!bVar15 * puVar1[4];
                                      puVar1[5] = (uint)bVar16 * auVar60._20_4_ |
                                                  (uint)!bVar16 * puVar1[5];
                                      puVar1[6] = (uint)bVar17 * auVar60._24_4_ |
                                                  (uint)!bVar17 * puVar1[6];
                                      puVar1[7] = (uint)bVar18 * auVar60._28_4_ |
                                                  (uint)!bVar18 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar60._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar19 * auVar60._36_4_ |
                                                  (uint)!bVar19 * puVar1[9];
                                      puVar1[10] = (uint)bVar20 * auVar60._40_4_ |
                                                   (uint)!bVar20 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar21 * auVar60._44_4_ |
                                                    (uint)!bVar21 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar22 * auVar60._48_4_ |
                                                    (uint)!bVar22 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar23 * auVar60._52_4_ |
                                                    (uint)!bVar23 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar24 * auVar60._56_4_ |
                                                    (uint)!bVar24 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar60._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar42 = uVar42 + 0x10;
                                    } while (((uVar43 - uVar41) + 0xf & 0xfffffffffffffff0) !=
                                             uVar42);
                                  }
                                  if (lVar7 - lVar35 != 0 && lVar35 <= lVar7) {
                                    auVar59 = vpbroadcastq_avx512f();
                                    uVar43 = 0;
                                    do {
                                      auVar60 = vpbroadcastq_avx512f();
                                      auVar61 = vporq_avx512f(auVar60,auVar58);
                                      auVar60 = vporq_avx512f(auVar60,auVar57);
                                      uVar49 = vpcmpuq_avx512f(auVar60,auVar59,2);
                                      uVar26 = vpcmpuq_avx512f(auVar61,auVar59,2);
                                      bVar28 = (byte)uVar26;
                                      uVar55 = CONCAT11(bVar28,(byte)uVar49);
                                      puVar1 = (uint *)((long)pvVar11 +
                                                       uVar43 * 4 + lVar35 * 4 + lVar47);
                                      bVar12 = (bool)((byte)uVar49 & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar19 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar20 = (bool)(bVar28 >> 1 & 1);
                                      bVar21 = (bool)(bVar28 >> 2 & 1);
                                      bVar22 = (bool)(bVar28 >> 3 & 1);
                                      bVar23 = (bool)(bVar28 >> 4 & 1);
                                      bVar24 = (bool)(bVar28 >> 5 & 1);
                                      bVar25 = (bool)(bVar28 >> 6 & 1);
                                      *puVar1 = (uint)bVar12 * auVar56._0_4_ |
                                                (uint)!bVar12 * *puVar1;
                                      puVar1[1] = (uint)bVar13 * auVar56._4_4_ |
                                                  (uint)!bVar13 * puVar1[1];
                                      puVar1[2] = (uint)bVar14 * auVar56._8_4_ |
                                                  (uint)!bVar14 * puVar1[2];
                                      puVar1[3] = (uint)bVar15 * auVar56._12_4_ |
                                                  (uint)!bVar15 * puVar1[3];
                                      puVar1[4] = (uint)bVar16 * auVar56._16_4_ |
                                                  (uint)!bVar16 * puVar1[4];
                                      puVar1[5] = (uint)bVar17 * auVar56._20_4_ |
                                                  (uint)!bVar17 * puVar1[5];
                                      puVar1[6] = (uint)bVar18 * auVar56._24_4_ |
                                                  (uint)!bVar18 * puVar1[6];
                                      puVar1[7] = (uint)bVar19 * auVar56._28_4_ |
                                                  (uint)!bVar19 * puVar1[7];
                                      puVar1[8] = (uint)(bVar28 & 1) * auVar56._32_4_ |
                                                  (uint)!(bool)(bVar28 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar20 * auVar56._36_4_ |
                                                  (uint)!bVar20 * puVar1[9];
                                      puVar1[10] = (uint)bVar21 * auVar56._40_4_ |
                                                   (uint)!bVar21 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar22 * auVar56._44_4_ |
                                                    (uint)!bVar22 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar23 * auVar56._48_4_ |
                                                    (uint)!bVar23 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar24 * auVar56._52_4_ |
                                                    (uint)!bVar24 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar25 * auVar56._56_4_ |
                                                    (uint)!bVar25 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar28 >> 7) * auVar56._60_4_ |
                                                    (uint)!(bool)(bVar28 >> 7) * puVar1[0xf];
                                      uVar43 = uVar43 + 0x10;
                                    } while (((lVar7 - lVar35) + 0xfU & 0xfffffffffffffff0) !=
                                             uVar43);
                                  }
                                  auVar74 = SUB6416(ZEXT464(0xff800000),0);
                                  if (0 < (int)n) {
                                    auVar58 = ZEXT464(0xff800000);
                                    uVar43 = 0;
                                    do {
                                      auVar74 = vmaxss_avx(auVar58._0_16_,
                                                           ZEXT416(*(uint *)((long)pvVar11 +
                                                                            uVar43 * 4 + lVar47)));
                                      auVar58 = ZEXT1664(auVar74);
                                      uVar43 = uVar43 + 1;
                                    } while ((n & 0x7fffffff) != uVar43);
                                  }
                                  local_160 = x + local_178;
                                  gVar73 = ggml_vec_soft_max_f32
                                                     (local_300,local_160,x,auVar74._0_4_);
                                  auVar58 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  auVar75._0_4_ = (float)(1.0 / gVar73);
                                  auVar75._4_4_ = (int)((ulong)(1.0 / gVar73) >> 0x20);
                                  auVar75._8_8_ = 0;
                                  auVar56 = vbroadcastss_avx512f(auVar75);
                                  if (0 < np) {
                                    lVar34 = local_338 + (long)pvVar11;
                                    uVar43 = 0;
                                    do {
                                      lVar36 = 0;
                                      do {
                                        auVar59 = vmulps_avx512f(auVar56,*(undefined1 (*) [64])
                                                                          (lVar34 + lVar36));
                                        *(undefined1 (*) [64])(lVar34 + lVar36) = auVar59;
                                        lVar36 = lVar36 + 0x40;
                                      } while (lVar36 != 0x100);
                                      uVar43 = uVar43 + 0x40;
                                      lVar34 = lVar34 + 0x100;
                                    } while (uVar43 < (n & 0xffffffc0));
                                  }
                                  if (np != n) {
                                    uVar43 = uVar41 | 1;
                                    if ((long)(uVar41 | 1) <= (long)(int)n) {
                                      uVar43 = (long)(int)n;
                                    }
                                    auVar59 = vpbroadcastq_avx512f();
                                    uVar42 = 0;
                                    lVar34 = uVar41 * 4 + local_338;
                                    do {
                                      auVar60 = vpbroadcastq_avx512f();
                                      auVar61 = vporq_avx512f(auVar60,auVar58);
                                      auVar60 = vporq_avx512f(auVar60,auVar57);
                                      uVar49 = vpcmpuq_avx512f(auVar60,auVar59,2);
                                      bVar28 = (byte)uVar49;
                                      uVar49 = vpcmpuq_avx512f(auVar61,auVar59,2);
                                      bVar29 = (byte)uVar49;
                                      uVar55 = CONCAT11(bVar29,bVar28);
                                      piVar2 = (int *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      auVar61._4_4_ = (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                      auVar61._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                      auVar61._8_4_ = (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                      auVar61._12_4_ = (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                      auVar61._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                      auVar61._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                      auVar61._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                      auVar61._28_4_ = (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                      auVar61._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                      auVar61._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                      auVar61._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                      auVar61._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                      auVar61._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                      auVar61._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                      auVar61._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                      auVar61._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                      auVar60 = vmulps_avx512f(auVar61,auVar56);
                                      puVar1 = (uint *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar19 = (bool)(bVar29 >> 1 & 1);
                                      bVar20 = (bool)(bVar29 >> 2 & 1);
                                      bVar21 = (bool)(bVar29 >> 3 & 1);
                                      bVar22 = (bool)(bVar29 >> 4 & 1);
                                      bVar23 = (bool)(bVar29 >> 5 & 1);
                                      bVar24 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar60._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar12 * auVar60._4_4_ |
                                                  (uint)!bVar12 * puVar1[1];
                                      puVar1[2] = (uint)bVar13 * auVar60._8_4_ |
                                                  (uint)!bVar13 * puVar1[2];
                                      puVar1[3] = (uint)bVar14 * auVar60._12_4_ |
                                                  (uint)!bVar14 * puVar1[3];
                                      puVar1[4] = (uint)bVar15 * auVar60._16_4_ |
                                                  (uint)!bVar15 * puVar1[4];
                                      puVar1[5] = (uint)bVar16 * auVar60._20_4_ |
                                                  (uint)!bVar16 * puVar1[5];
                                      puVar1[6] = (uint)bVar17 * auVar60._24_4_ |
                                                  (uint)!bVar17 * puVar1[6];
                                      puVar1[7] = (uint)bVar18 * auVar60._28_4_ |
                                                  (uint)!bVar18 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar60._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar19 * auVar60._36_4_ |
                                                  (uint)!bVar19 * puVar1[9];
                                      puVar1[10] = (uint)bVar20 * auVar60._40_4_ |
                                                   (uint)!bVar20 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar21 * auVar60._44_4_ |
                                                    (uint)!bVar21 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar22 * auVar60._48_4_ |
                                                    (uint)!bVar22 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar23 * auVar60._52_4_ |
                                                    (uint)!bVar23 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar24 * auVar60._56_4_ |
                                                    (uint)!bVar24 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar60._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar42 = uVar42 + 0x10;
                                    } while (((uVar43 - uVar41) + 0xf & 0xfffffffffffffff0) !=
                                             uVar42);
                                  }
                                  if (0 < (int)n) {
                                    memset(x,0,(ulong)(n & 0x7fffffff) << 2);
                                    auVar57 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar58 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  }
                                  if (0 < lVar6) {
                                    auVar56 = vpbroadcastq_avx512f();
                                    local_158 = (void *)((long)pvVar11 + lVar47);
                                    lVar34 = (long)(int)n;
                                    if ((long)(int)n < (long)(uVar41 + 1)) {
                                      lVar34 = uVar41 + 1;
                                    }
                                    local_140 = local_378 * local_2d8 + local_2d0;
                                    lVar36 = local_1a0 + uVar41 * 4;
                                    lVar45 = 0;
                                    lVar38 = local_1a0;
                                    do {
                                      pvVar39 = local_318->data;
                                      auVar59 = vbroadcastss_avx512f
                                                          (ZEXT416(*(uint *)((long)local_280->data +
                                                                            local_278 +
                                                                            local_140 +
                                                                            lVar45 * local_288)));
                                      if (0 < np) {
                                        lVar46 = (long)pvVar39 + lVar38;
                                        uVar43 = 0;
                                        pvVar48 = local_158;
                                        do {
                                          lVar37 = 0;
                                          do {
                                            auVar60 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar46 + lVar37),auVar59
                                                                          ,*(undefined1 (*) [64])
                                                                            ((long)pvVar48 + lVar37)
                                                                         );
                                            *(undefined1 (*) [64])((long)pvVar48 + lVar37) = auVar60
                                            ;
                                            lVar37 = lVar37 + 0x40;
                                          } while (lVar37 != 0x100);
                                          uVar43 = uVar43 + 0x40;
                                          pvVar48 = (void *)((long)pvVar48 + 0x100);
                                          lVar46 = lVar46 + 0x100;
                                        } while (uVar43 < (n & 0xffffffc0));
                                      }
                                      if (np != n) {
                                        auVar59 = vbroadcastss_avx512f(auVar59._0_16_);
                                        uVar43 = 0;
                                        do {
                                          auVar60 = vpbroadcastq_avx512f();
                                          auVar61 = vporq_avx512f(auVar60,auVar58);
                                          auVar60 = vporq_avx512f(auVar60,auVar57);
                                          uVar49 = vpcmpuq_avx512f(auVar60,auVar56,2);
                                          bVar28 = (byte)uVar49;
                                          uVar49 = vpcmpuq_avx512f(auVar61,auVar56,2);
                                          bVar29 = (byte)uVar49;
                                          uVar55 = CONCAT11(bVar29,bVar28);
                                          piVar2 = (int *)((long)pvVar39 + uVar43 * 4 + lVar36);
                                          auVar63._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar63._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar63._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar63._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar63._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar63._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar63._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar63._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar63._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar63._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar63._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar63._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar63._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar63._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar63._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar63._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          piVar2 = (int *)((long)local_158 + uVar43 * 4 + uVar41 * 4
                                                          );
                                          auVar64._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar64._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar64._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar64._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar64._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar64._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar64._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar64._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar64._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar64._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar64._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar64._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar64._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar64._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar64._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar64._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          auVar60 = vfmadd231ps_avx512f(auVar64,auVar59,auVar63);
                                          puVar1 = (uint *)((long)local_158 +
                                                           uVar43 * 4 + uVar41 * 4);
                                          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                          bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                          bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                          bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                          bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                          bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                          bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                          bVar19 = (bool)(bVar29 >> 1 & 1);
                                          bVar20 = (bool)(bVar29 >> 2 & 1);
                                          bVar21 = (bool)(bVar29 >> 3 & 1);
                                          bVar22 = (bool)(bVar29 >> 4 & 1);
                                          bVar23 = (bool)(bVar29 >> 5 & 1);
                                          bVar24 = (bool)(bVar29 >> 6 & 1);
                                          *puVar1 = (uint)(bVar28 & 1) * auVar60._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * *puVar1;
                                          puVar1[1] = (uint)bVar12 * auVar60._4_4_ |
                                                      (uint)!bVar12 * puVar1[1];
                                          puVar1[2] = (uint)bVar13 * auVar60._8_4_ |
                                                      (uint)!bVar13 * puVar1[2];
                                          puVar1[3] = (uint)bVar14 * auVar60._12_4_ |
                                                      (uint)!bVar14 * puVar1[3];
                                          puVar1[4] = (uint)bVar15 * auVar60._16_4_ |
                                                      (uint)!bVar15 * puVar1[4];
                                          puVar1[5] = (uint)bVar16 * auVar60._20_4_ |
                                                      (uint)!bVar16 * puVar1[5];
                                          puVar1[6] = (uint)bVar17 * auVar60._24_4_ |
                                                      (uint)!bVar17 * puVar1[6];
                                          puVar1[7] = (uint)bVar18 * auVar60._28_4_ |
                                                      (uint)!bVar18 * puVar1[7];
                                          puVar1[8] = (uint)(bVar29 & 1) * auVar60._32_4_ |
                                                      (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                          puVar1[9] = (uint)bVar19 * auVar60._36_4_ |
                                                      (uint)!bVar19 * puVar1[9];
                                          puVar1[10] = (uint)bVar20 * auVar60._40_4_ |
                                                       (uint)!bVar20 * puVar1[10];
                                          puVar1[0xb] = (uint)bVar21 * auVar60._44_4_ |
                                                        (uint)!bVar21 * puVar1[0xb];
                                          puVar1[0xc] = (uint)bVar22 * auVar60._48_4_ |
                                                        (uint)!bVar22 * puVar1[0xc];
                                          puVar1[0xd] = (uint)bVar23 * auVar60._52_4_ |
                                                        (uint)!bVar23 * puVar1[0xd];
                                          puVar1[0xe] = (uint)bVar24 * auVar60._56_4_ |
                                                        (uint)!bVar24 * puVar1[0xe];
                                          puVar1[0xf] = (uint)(bVar29 >> 7) * auVar60._60_4_ |
                                                        (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                          uVar43 = uVar43 + 0x10;
                                        } while (((lVar34 - uVar41) + 0xf & 0xfffffffffffffff0) !=
                                                 uVar43);
                                      }
                                      lVar45 = lVar45 + 1;
                                      lVar38 = lVar38 + local_148;
                                      lVar36 = lVar36 + local_148;
                                    } while (lVar45 != lVar6);
                                  }
                                  local_34c = 0.0;
                                  ggml_vec_dot_f32(n,&local_34c,0,local_160,0,x,0,1);
                                  auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  auVar56 = vmovdqu64_avx512f(local_b8);
                                  if (0 < iVar27) {
                                    auVar59 = vbroadcastss_avx512f(ZEXT416((uint)local_34c));
                                    uVar43 = 0;
                                    do {
                                      auVar60 = vpbroadcastq_avx512f();
                                      auVar61 = vporq_avx512f(auVar60,auVar57);
                                      auVar60 = vporq_avx512f(auVar60,auVar58);
                                      uVar49 = vpcmpuq_avx512f(auVar60,auVar56,2);
                                      bVar28 = (byte)uVar49;
                                      uVar49 = vpcmpuq_avx512f(auVar61,auVar56,2);
                                      bVar29 = (byte)uVar49;
                                      uVar55 = CONCAT11(bVar29,bVar28);
                                      piVar2 = (int *)((long)pvVar11 + uVar43 * 4 + lVar47);
                                      auVar62._4_4_ = (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                      auVar62._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                      auVar62._8_4_ = (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                      auVar62._12_4_ = (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                      auVar62._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                      auVar62._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                      auVar62._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                      auVar62._28_4_ = (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                      auVar62._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                      auVar62._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                      auVar62._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                      auVar62._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                      auVar62._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                      auVar62._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                      auVar62._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                      auVar62._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                      auVar60 = vsubps_avx512f(auVar62,auVar59);
                                      puVar1 = (uint *)((long)pvVar11 + uVar43 * 4 + lVar47);
                                      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar19 = (bool)(bVar29 >> 1 & 1);
                                      bVar20 = (bool)(bVar29 >> 2 & 1);
                                      bVar21 = (bool)(bVar29 >> 3 & 1);
                                      bVar22 = (bool)(bVar29 >> 4 & 1);
                                      bVar23 = (bool)(bVar29 >> 5 & 1);
                                      bVar24 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar60._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar12 * auVar60._4_4_ |
                                                  (uint)!bVar12 * puVar1[1];
                                      puVar1[2] = (uint)bVar13 * auVar60._8_4_ |
                                                  (uint)!bVar13 * puVar1[2];
                                      puVar1[3] = (uint)bVar14 * auVar60._12_4_ |
                                                  (uint)!bVar14 * puVar1[3];
                                      puVar1[4] = (uint)bVar15 * auVar60._16_4_ |
                                                  (uint)!bVar15 * puVar1[4];
                                      puVar1[5] = (uint)bVar16 * auVar60._20_4_ |
                                                  (uint)!bVar16 * puVar1[5];
                                      puVar1[6] = (uint)bVar17 * auVar60._24_4_ |
                                                  (uint)!bVar17 * puVar1[6];
                                      puVar1[7] = (uint)bVar18 * auVar60._28_4_ |
                                                  (uint)!bVar18 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar60._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar19 * auVar60._36_4_ |
                                                  (uint)!bVar19 * puVar1[9];
                                      puVar1[10] = (uint)bVar20 * auVar60._40_4_ |
                                                   (uint)!bVar20 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar21 * auVar60._44_4_ |
                                                    (uint)!bVar21 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar22 * auVar60._48_4_ |
                                                    (uint)!bVar22 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar23 * auVar60._52_4_ |
                                                    (uint)!bVar23 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar24 * auVar60._56_4_ |
                                                    (uint)!bVar24 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar60._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar43 = uVar43 + 0x10;
                                    } while (local_188 != uVar43);
                                  }
                                  auVar56 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                  auVar59 = vmovdqu64_avx512f(local_78);
                                  auVar60 = vmovdqu64_avx512f(local_f8);
                                  if (0 < (int)n) {
                                    uVar43 = 0;
                                    do {
                                      *(float *)((long)pvVar11 + uVar43 * 4 + lVar47) =
                                           *(float *)((long)pvVar11 + uVar43 * 4 + lVar47) *
                                           *(float *)((long)pvVar11 + uVar43 * 4 + local_338);
                                      uVar43 = uVar43 + 1;
                                    } while ((n & 0x7fffffff) != uVar43);
                                  }
                                  if (0 < np) {
                                    pvVar39 = (void *)(lVar47 + (long)pvVar11);
                                    uVar43 = 0;
                                    do {
                                      lVar34 = 0;
                                      do {
                                        auVar61 = vmulps_avx512f(local_138,
                                                                 *(undefined1 (*) [64])
                                                                  ((long)pvVar39 + lVar34));
                                        *(undefined1 (*) [64])((long)pvVar39 + lVar34) = auVar61;
                                        lVar34 = lVar34 + 0x40;
                                      } while (lVar34 != 0x100);
                                      uVar43 = uVar43 + 0x40;
                                      pvVar39 = (void *)((long)pvVar39 + 0x100);
                                    } while (uVar43 < (n & 0xffffffc0));
                                  }
                                  if (np != n) {
                                    uVar43 = uVar41 | 1;
                                    if ((long)(uVar41 | 1) <= (long)(int)n) {
                                      uVar43 = (long)(int)n;
                                    }
                                    auVar61 = vpbroadcastq_avx512f();
                                    uVar42 = 0;
                                    lVar34 = uVar41 * 4 + lVar47;
                                    do {
                                      auVar63 = vpbroadcastq_avx512f();
                                      auVar64 = vporq_avx512f(auVar63,auVar57);
                                      auVar63 = vporq_avx512f(auVar63,auVar58);
                                      uVar49 = vpcmpuq_avx512f(auVar63,auVar61,2);
                                      bVar28 = (byte)uVar49;
                                      uVar49 = vpcmpuq_avx512f(auVar64,auVar61,2);
                                      bVar29 = (byte)uVar49;
                                      uVar55 = CONCAT11(bVar29,bVar28);
                                      piVar2 = (int *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      auVar65._4_4_ = (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                      auVar65._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                      auVar65._8_4_ = (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                      auVar65._12_4_ = (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                      auVar65._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                      auVar65._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                      auVar65._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                      auVar65._28_4_ = (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                      auVar65._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                      auVar65._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                      auVar65._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                      auVar65._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                      auVar65._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                      auVar65._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                      auVar65._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                      auVar65._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                      auVar63 = vmulps_avx512f(local_138,auVar65);
                                      puVar1 = (uint *)((long)pvVar11 + uVar42 * 4 + lVar34);
                                      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                      bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                      bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                      bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                      bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                      bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                      bVar19 = (bool)(bVar29 >> 1 & 1);
                                      bVar20 = (bool)(bVar29 >> 2 & 1);
                                      bVar21 = (bool)(bVar29 >> 3 & 1);
                                      bVar22 = (bool)(bVar29 >> 4 & 1);
                                      bVar23 = (bool)(bVar29 >> 5 & 1);
                                      bVar24 = (bool)(bVar29 >> 6 & 1);
                                      *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                (uint)!(bool)(bVar28 & 1) * *puVar1;
                                      puVar1[1] = (uint)bVar12 * auVar63._4_4_ |
                                                  (uint)!bVar12 * puVar1[1];
                                      puVar1[2] = (uint)bVar13 * auVar63._8_4_ |
                                                  (uint)!bVar13 * puVar1[2];
                                      puVar1[3] = (uint)bVar14 * auVar63._12_4_ |
                                                  (uint)!bVar14 * puVar1[3];
                                      puVar1[4] = (uint)bVar15 * auVar63._16_4_ |
                                                  (uint)!bVar15 * puVar1[4];
                                      puVar1[5] = (uint)bVar16 * auVar63._20_4_ |
                                                  (uint)!bVar16 * puVar1[5];
                                      puVar1[6] = (uint)bVar17 * auVar63._24_4_ |
                                                  (uint)!bVar17 * puVar1[6];
                                      puVar1[7] = (uint)bVar18 * auVar63._28_4_ |
                                                  (uint)!bVar18 * puVar1[7];
                                      puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                  (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                      puVar1[9] = (uint)bVar19 * auVar63._36_4_ |
                                                  (uint)!bVar19 * puVar1[9];
                                      puVar1[10] = (uint)bVar20 * auVar63._40_4_ |
                                                   (uint)!bVar20 * puVar1[10];
                                      puVar1[0xb] = (uint)bVar21 * auVar63._44_4_ |
                                                    (uint)!bVar21 * puVar1[0xb];
                                      puVar1[0xc] = (uint)bVar22 * auVar63._48_4_ |
                                                    (uint)!bVar22 * puVar1[0xc];
                                      puVar1[0xd] = (uint)bVar23 * auVar63._52_4_ |
                                                    (uint)!bVar23 * puVar1[0xd];
                                      puVar1[0xe] = (uint)bVar24 * auVar63._56_4_ |
                                                    (uint)!bVar24 * puVar1[0xe];
                                      puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                    (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                      uVar42 = uVar42 + 0x10;
                                    } while (((uVar43 - uVar41) + 0xf & 0xfffffffffffffff0) !=
                                             uVar42);
                                  }
                                  if (0 < lVar35) {
                                    lVar38 = 0;
                                    lVar34 = local_1a8;
                                    lVar36 = local_310;
                                    do {
                                      pvVar39 = pgVar5->data;
                                      auVar61 = vbroadcastss_avx512f(ZEXT416((uint)x[lVar38]));
                                      uVar54 = (uint)uVar51;
                                      if (0 < (int)uVar54) {
                                        lVar45 = (long)pvVar39 + lVar36;
                                        uVar43 = 0;
                                        pvVar48 = local_2b0;
                                        do {
                                          lVar46 = 0;
                                          do {
                                            auVar63 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar45 + lVar46),auVar61
                                                                          ,*(undefined1 (*) [64])
                                                                            ((long)pvVar48 + lVar46)
                                                                         );
                                            *(undefined1 (*) [64])((long)pvVar48 + lVar46) = auVar63
                                            ;
                                            lVar46 = lVar46 + 0x40;
                                          } while (lVar46 != 0x100);
                                          uVar43 = uVar43 + 0x40;
                                          pvVar48 = (void *)((long)pvVar48 + 0x100);
                                          lVar45 = lVar45 + 0x100;
                                        } while (uVar43 < uVar51);
                                      }
                                      if (uVar54 != n_00) {
                                        auVar61 = vbroadcastss_avx512f(auVar61._0_16_);
                                        uVar43 = 0;
                                        do {
                                          auVar63 = vpbroadcastq_avx512f();
                                          auVar64 = vporq_avx512f(auVar63,auVar57);
                                          auVar63 = vporq_avx512f(auVar63,auVar58);
                                          uVar49 = vpcmpuq_avx512f(auVar63,auVar60,2);
                                          bVar28 = (byte)uVar49;
                                          uVar49 = vpcmpuq_avx512f(auVar64,auVar60,2);
                                          bVar29 = (byte)uVar49;
                                          uVar55 = CONCAT11(bVar29,bVar28);
                                          piVar2 = (int *)((long)pvVar39 + uVar43 * 4 + lVar34);
                                          auVar66._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar66._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar66._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar66._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar66._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar66._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar66._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar66._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar66._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar66._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar66._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar66._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar66._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar66._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar66._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar66._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          piVar2 = (int *)((long)pvVar31 + uVar43 * 4);
                                          auVar67._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar67._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar67._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar67._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar67._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar67._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar67._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar67._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar67._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar67._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar67._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar67._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar67._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar67._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar67._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar67._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          auVar63 = vfmadd231ps_avx512f(auVar67,auVar61,auVar66);
                                          puVar1 = (uint *)((long)pvVar31 + uVar43 * 4);
                                          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                          bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                          bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                          bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                          bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                          bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                          bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                          bVar19 = (bool)(bVar29 >> 1 & 1);
                                          bVar20 = (bool)(bVar29 >> 2 & 1);
                                          bVar21 = (bool)(bVar29 >> 3 & 1);
                                          bVar22 = (bool)(bVar29 >> 4 & 1);
                                          bVar23 = (bool)(bVar29 >> 5 & 1);
                                          bVar24 = (bool)(bVar29 >> 6 & 1);
                                          *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * *puVar1;
                                          puVar1[1] = (uint)bVar12 * auVar63._4_4_ |
                                                      (uint)!bVar12 * puVar1[1];
                                          puVar1[2] = (uint)bVar13 * auVar63._8_4_ |
                                                      (uint)!bVar13 * puVar1[2];
                                          puVar1[3] = (uint)bVar14 * auVar63._12_4_ |
                                                      (uint)!bVar14 * puVar1[3];
                                          puVar1[4] = (uint)bVar15 * auVar63._16_4_ |
                                                      (uint)!bVar15 * puVar1[4];
                                          puVar1[5] = (uint)bVar16 * auVar63._20_4_ |
                                                      (uint)!bVar16 * puVar1[5];
                                          puVar1[6] = (uint)bVar17 * auVar63._24_4_ |
                                                      (uint)!bVar17 * puVar1[6];
                                          puVar1[7] = (uint)bVar18 * auVar63._28_4_ |
                                                      (uint)!bVar18 * puVar1[7];
                                          puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                      (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                          puVar1[9] = (uint)bVar19 * auVar63._36_4_ |
                                                      (uint)!bVar19 * puVar1[9];
                                          puVar1[10] = (uint)bVar20 * auVar63._40_4_ |
                                                       (uint)!bVar20 * puVar1[10];
                                          puVar1[0xb] = (uint)bVar21 * auVar63._44_4_ |
                                                        (uint)!bVar21 * puVar1[0xb];
                                          puVar1[0xc] = (uint)bVar22 * auVar63._48_4_ |
                                                        (uint)!bVar22 * puVar1[0xc];
                                          puVar1[0xd] = (uint)bVar23 * auVar63._52_4_ |
                                                        (uint)!bVar23 * puVar1[0xd];
                                          puVar1[0xe] = (uint)bVar24 * auVar63._56_4_ |
                                                        (uint)!bVar24 * puVar1[0xe];
                                          puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                        (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                          uVar43 = uVar43 + 0x10;
                                        } while (uVar52 != uVar43);
                                      }
                                      lVar38 = lVar38 + 1;
                                      lVar36 = lVar36 + local_298;
                                      lVar34 = lVar34 + local_298;
                                    } while (lVar38 != lVar35);
                                    lVar38 = 0;
                                    lVar34 = local_1b8;
                                    lVar36 = local_1c0;
                                    do {
                                      pvVar39 = local_2c0->data;
                                      auVar61 = vbroadcastss_avx512f(ZEXT416((uint)x[lVar38]));
                                      if (0 < (int)uVar54) {
                                        uVar43 = 0;
                                        lVar46 = local_2a8 + (long)pvVar39;
                                        lVar45 = lVar36;
                                        do {
                                          lVar37 = 0;
                                          do {
                                            auVar63 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar46 + lVar37),auVar61
                                                                          ,*(undefined1 (*) [64])
                                                                            (lVar45 + lVar37));
                                            *(undefined1 (*) [64])(lVar45 + lVar37) = auVar63;
                                            lVar37 = lVar37 + 0x40;
                                          } while (lVar37 != 0x100);
                                          uVar43 = uVar43 + 0x40;
                                          lVar45 = lVar45 + 0x100;
                                          lVar46 = lVar46 + 0x100;
                                        } while (uVar43 < uVar51);
                                      }
                                      if (uVar54 != n_00) {
                                        auVar61 = vbroadcastss_avx512f(auVar61._0_16_);
                                        uVar43 = 0;
                                        do {
                                          auVar63 = vpbroadcastq_avx512f();
                                          auVar64 = vporq_avx512f(auVar63,auVar57);
                                          auVar63 = vporq_avx512f(auVar63,auVar58);
                                          uVar49 = vpcmpuq_avx512f(auVar63,auVar60,2);
                                          bVar28 = (byte)uVar49;
                                          uVar49 = vpcmpuq_avx512f(auVar64,auVar60,2);
                                          bVar29 = (byte)uVar49;
                                          uVar55 = CONCAT11(bVar29,bVar28);
                                          piVar2 = (int *)((long)pvVar39 + uVar43 * 4 + local_2b8);
                                          auVar68._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar68._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar68._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar68._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar68._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar68._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar68._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar68._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar68._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar68._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar68._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar68._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar68._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar68._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar68._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar68._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          piVar2 = (int *)(lVar34 + uVar43 * 4);
                                          auVar69._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar69._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar69._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar69._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar69._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar69._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar69._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar69._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar69._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar69._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar69._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar69._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar69._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar69._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar69._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar69._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          auVar63 = vfmadd231ps_avx512f(auVar69,auVar61,auVar68);
                                          puVar1 = (uint *)(lVar34 + uVar43 * 4);
                                          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                          bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                          bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                          bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                          bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                          bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                          bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                          bVar19 = (bool)(bVar29 >> 1 & 1);
                                          bVar20 = (bool)(bVar29 >> 2 & 1);
                                          bVar21 = (bool)(bVar29 >> 3 & 1);
                                          bVar22 = (bool)(bVar29 >> 4 & 1);
                                          bVar23 = (bool)(bVar29 >> 5 & 1);
                                          bVar24 = (bool)(bVar29 >> 6 & 1);
                                          *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * *puVar1;
                                          puVar1[1] = (uint)bVar12 * auVar63._4_4_ |
                                                      (uint)!bVar12 * puVar1[1];
                                          puVar1[2] = (uint)bVar13 * auVar63._8_4_ |
                                                      (uint)!bVar13 * puVar1[2];
                                          puVar1[3] = (uint)bVar14 * auVar63._12_4_ |
                                                      (uint)!bVar14 * puVar1[3];
                                          puVar1[4] = (uint)bVar15 * auVar63._16_4_ |
                                                      (uint)!bVar15 * puVar1[4];
                                          puVar1[5] = (uint)bVar16 * auVar63._20_4_ |
                                                      (uint)!bVar16 * puVar1[5];
                                          puVar1[6] = (uint)bVar17 * auVar63._24_4_ |
                                                      (uint)!bVar17 * puVar1[6];
                                          puVar1[7] = (uint)bVar18 * auVar63._28_4_ |
                                                      (uint)!bVar18 * puVar1[7];
                                          puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                      (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                          puVar1[9] = (uint)bVar19 * auVar63._36_4_ |
                                                      (uint)!bVar19 * puVar1[9];
                                          puVar1[10] = (uint)bVar20 * auVar63._40_4_ |
                                                       (uint)!bVar20 * puVar1[10];
                                          puVar1[0xb] = (uint)bVar21 * auVar63._44_4_ |
                                                        (uint)!bVar21 * puVar1[0xb];
                                          puVar1[0xc] = (uint)bVar22 * auVar63._48_4_ |
                                                        (uint)!bVar22 * puVar1[0xc];
                                          puVar1[0xd] = (uint)bVar23 * auVar63._52_4_ |
                                                        (uint)!bVar23 * puVar1[0xd];
                                          puVar1[0xe] = (uint)bVar24 * auVar63._56_4_ |
                                                        (uint)!bVar24 * puVar1[0xe];
                                          puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                        (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                          uVar43 = uVar43 + 0x10;
                                        } while (uVar52 != uVar43);
                                      }
                                      lVar38 = lVar38 + 1;
                                      lVar36 = lVar36 + local_2a0;
                                      lVar34 = lVar34 + local_2a0;
                                    } while (lVar38 != lVar35);
                                  }
                                  if (0 < lVar6) {
                                    auVar60 = vpbroadcastq_avx512f();
                                    lVar34 = local_1b0 + uVar41 * 4;
                                    lVar35 = (long)(int)n;
                                    if ((long)(int)n < (long)(uVar41 + 1)) {
                                      lVar35 = uVar41 + 1;
                                    }
                                    lVar38 = 0;
                                    lVar36 = local_1c8;
                                    do {
                                      auVar61 = vbroadcastss_avx512f
                                                          (ZEXT416(*(uint *)((long)local_280->data +
                                                                            local_278 +
                                                                            local_378 * local_2d8 +
                                                                            local_2d0 +
                                                                            lVar38 * local_288)));
                                      if (0 < np) {
                                        uVar51 = 0;
                                        lVar45 = (long)pvVar11 + local_338;
                                        lVar46 = lVar36;
                                        do {
                                          lVar37 = 0;
                                          do {
                                            auVar63 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                           (lVar45 + lVar37),auVar61
                                                                          ,*(undefined1 (*) [64])
                                                                            (lVar46 + lVar37));
                                            *(undefined1 (*) [64])(lVar46 + lVar37) = auVar63;
                                            lVar37 = lVar37 + 0x40;
                                          } while (lVar37 != 0x100);
                                          uVar51 = uVar51 + 0x40;
                                          lVar46 = lVar46 + 0x100;
                                          lVar45 = lVar45 + 0x100;
                                        } while (uVar51 < (n & 0xffffffc0));
                                      }
                                      if (np != n) {
                                        auVar61 = vbroadcastss_avx512f(auVar61._0_16_);
                                        uVar51 = 0;
                                        do {
                                          auVar63 = vpbroadcastq_avx512f();
                                          auVar64 = vporq_avx512f(auVar63,auVar57);
                                          auVar63 = vporq_avx512f(auVar63,auVar58);
                                          uVar49 = vpcmpuq_avx512f(auVar63,auVar60,2);
                                          bVar28 = (byte)uVar49;
                                          uVar49 = vpcmpuq_avx512f(auVar64,auVar60,2);
                                          bVar29 = (byte)uVar49;
                                          uVar55 = CONCAT11(bVar29,bVar28);
                                          piVar2 = (int *)((long)pvVar11 + local_338 + uVar41 * 4 +
                                                          uVar51 * 4);
                                          auVar70._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar70._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar70._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar70._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar70._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar70._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar70._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar70._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar70._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar70._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar70._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar70._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar70._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar70._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar70._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar70._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          piVar2 = (int *)(lVar34 + uVar51 * 4);
                                          auVar71._4_4_ =
                                               (uint)((byte)(uVar55 >> 1) & 1) * piVar2[1];
                                          auVar71._0_4_ = (uint)(bVar28 & 1) * *piVar2;
                                          auVar71._8_4_ =
                                               (uint)((byte)(uVar55 >> 2) & 1) * piVar2[2];
                                          auVar71._12_4_ =
                                               (uint)((byte)(uVar55 >> 3) & 1) * piVar2[3];
                                          auVar71._16_4_ =
                                               (uint)((byte)(uVar55 >> 4) & 1) * piVar2[4];
                                          auVar71._20_4_ =
                                               (uint)((byte)(uVar55 >> 5) & 1) * piVar2[5];
                                          auVar71._24_4_ =
                                               (uint)((byte)(uVar55 >> 6) & 1) * piVar2[6];
                                          auVar71._28_4_ =
                                               (uint)((byte)(uVar55 >> 7) & 1) * piVar2[7];
                                          auVar71._32_4_ = (uint)(bVar29 & 1) * piVar2[8];
                                          auVar71._36_4_ = (uint)(bVar29 >> 1 & 1) * piVar2[9];
                                          auVar71._40_4_ = (uint)(bVar29 >> 2 & 1) * piVar2[10];
                                          auVar71._44_4_ = (uint)(bVar29 >> 3 & 1) * piVar2[0xb];
                                          auVar71._48_4_ = (uint)(bVar29 >> 4 & 1) * piVar2[0xc];
                                          auVar71._52_4_ = (uint)(bVar29 >> 5 & 1) * piVar2[0xd];
                                          auVar71._56_4_ = (uint)(bVar29 >> 6 & 1) * piVar2[0xe];
                                          auVar71._60_4_ = (uint)(bVar29 >> 7) * piVar2[0xf];
                                          auVar63 = vfmadd231ps_avx512f(auVar71,auVar61,auVar70);
                                          puVar1 = (uint *)(lVar34 + uVar51 * 4);
                                          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
                                          bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
                                          bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
                                          bVar15 = (bool)((byte)(uVar55 >> 4) & 1);
                                          bVar16 = (bool)((byte)(uVar55 >> 5) & 1);
                                          bVar17 = (bool)((byte)(uVar55 >> 6) & 1);
                                          bVar18 = (bool)((byte)(uVar55 >> 7) & 1);
                                          bVar19 = (bool)(bVar29 >> 1 & 1);
                                          bVar20 = (bool)(bVar29 >> 2 & 1);
                                          bVar21 = (bool)(bVar29 >> 3 & 1);
                                          bVar22 = (bool)(bVar29 >> 4 & 1);
                                          bVar23 = (bool)(bVar29 >> 5 & 1);
                                          bVar24 = (bool)(bVar29 >> 6 & 1);
                                          *puVar1 = (uint)(bVar28 & 1) * auVar63._0_4_ |
                                                    (uint)!(bool)(bVar28 & 1) * *puVar1;
                                          puVar1[1] = (uint)bVar12 * auVar63._4_4_ |
                                                      (uint)!bVar12 * puVar1[1];
                                          puVar1[2] = (uint)bVar13 * auVar63._8_4_ |
                                                      (uint)!bVar13 * puVar1[2];
                                          puVar1[3] = (uint)bVar14 * auVar63._12_4_ |
                                                      (uint)!bVar14 * puVar1[3];
                                          puVar1[4] = (uint)bVar15 * auVar63._16_4_ |
                                                      (uint)!bVar15 * puVar1[4];
                                          puVar1[5] = (uint)bVar16 * auVar63._20_4_ |
                                                      (uint)!bVar16 * puVar1[5];
                                          puVar1[6] = (uint)bVar17 * auVar63._24_4_ |
                                                      (uint)!bVar17 * puVar1[6];
                                          puVar1[7] = (uint)bVar18 * auVar63._28_4_ |
                                                      (uint)!bVar18 * puVar1[7];
                                          puVar1[8] = (uint)(bVar29 & 1) * auVar63._32_4_ |
                                                      (uint)!(bool)(bVar29 & 1) * puVar1[8];
                                          puVar1[9] = (uint)bVar19 * auVar63._36_4_ |
                                                      (uint)!bVar19 * puVar1[9];
                                          puVar1[10] = (uint)bVar20 * auVar63._40_4_ |
                                                       (uint)!bVar20 * puVar1[10];
                                          puVar1[0xb] = (uint)bVar21 * auVar63._44_4_ |
                                                        (uint)!bVar21 * puVar1[0xb];
                                          puVar1[0xc] = (uint)bVar22 * auVar63._48_4_ |
                                                        (uint)!bVar22 * puVar1[0xc];
                                          puVar1[0xd] = (uint)bVar23 * auVar63._52_4_ |
                                                        (uint)!bVar23 * puVar1[0xd];
                                          puVar1[0xe] = (uint)bVar24 * auVar63._56_4_ |
                                                        (uint)!bVar24 * puVar1[0xe];
                                          puVar1[0xf] = (uint)(bVar29 >> 7) * auVar63._60_4_ |
                                                        (uint)!(bool)(bVar29 >> 7) * puVar1[0xf];
                                          uVar51 = uVar51 + 0x10;
                                        } while (((lVar35 - uVar41) + 0xf & 0xfffffffffffffff0) !=
                                                 uVar51);
                                      }
                                      lVar38 = lVar38 + 1;
                                      lVar36 = lVar36 + local_150;
                                      lVar34 = lVar34 + local_150;
                                    } while (lVar38 != lVar6);
                                  }
                                  local_2b0 = (void *)((long)local_2b0 + local_2a0);
                                  local_2a8 = local_2a8 + local_2c8;
                                  local_2b8 = local_2b8 + local_2c8;
                                  local_378 = local_378 + 1;
                                  local_168 = (void *)((long)pvVar31 + local_2a0);
                                  pgVar50 = local_348;
                                  lVar34 = local_310;
                                  uVar52 = local_180;
                                } while (local_378 != local_340);
                              }
                              local_38c = local_38c + local_388;
                              local_320 = local_320 + 1;
                            } while (local_320 != local_1d8);
                          }
                          local_2f8 = local_2f8 + 1;
                        } while (iVar32 != (int)local_2f8);
                      }
                      return;
                    }
                    pcVar40 = "ggml_blck_size(result_type) == 1";
                    uVar49 = 0x1bfd;
                  }
                }
                else {
                  pcVar40 = "nb0 == sizeof(float)";
                  uVar49 = 0x1bef;
                }
              }
              else {
                pcVar40 = "ned1 == N";
                uVar49 = 0x1bec;
              }
            }
            else {
              pcVar40 = "ned0 == D";
              uVar49 = 0x1be7;
            }
          }
          else {
            pcVar40 = "nev1 == D";
            uVar49 = 0x1be6;
          }
        }
        else {
          pcVar40 = "nek0 == D";
          uVar49 = 0x1be5;
        }
      }
      else {
        pcVar40 = "nbv0 == sizeof(float)";
        uVar49 = 0x1be2;
      }
    }
    else {
      pcVar40 = "nbk0 == sizeof(float)";
      uVar49 = 0x1be1;
    }
  }
  else {
    pcVar40 = "nbq0 == sizeof(float)";
    uVar49 = 0x1be0;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar49,"GGML_ASSERT(%s) failed",pcVar40);
}

Assistant:

void ggml_compute_forward_flash_attn_back(
        const ggml_compute_params * params,
        const bool masked,
        ggml_tensor * dst) {

    const ggml_tensor * q = dst->src[0];

    switch (q->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_flash_attn_back_f32(params, masked, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}